

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O3

void __thiscall
nuraft::nuraft_global_mgr::close_raft_server(nuraft_global_mgr *this,raft_server *server)

{
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *plVar1;
  element_type *peVar2;
  int iVar3;
  iterator iVar4;
  undefined8 uVar5;
  undefined8 local_58;
  string local_50;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->append_queue_lock_);
  if (iVar3 == 0) {
    plVar1 = &this->append_queue_;
    iVar4._M_node = (_List_node_base *)plVar1;
    do {
      iVar4._M_node = (iVar4._M_node)->_M_next;
      if (iVar4._M_node == (_List_node_base *)plVar1) {
        local_58 = 0;
        goto LAB_001e7a8d;
      }
    } while ((raft_server *)iVar4._M_node[1]._M_next != server);
    std::
    _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->append_server_set_)._M_h,iVar4._M_node + 1);
    std::__cxx11::
    list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
    ::_M_erase(plVar1,iVar4);
    local_58 = 1;
LAB_001e7a8d:
    pthread_mutex_unlock((pthread_mutex_t *)&this->append_queue_lock_);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->commit_queue_lock_);
    if (iVar3 == 0) {
      plVar1 = &this->commit_queue_;
      uVar5 = 0;
      iVar4._M_node = (_List_node_base *)plVar1;
      do {
        iVar4._M_node = (iVar4._M_node)->_M_next;
        if (iVar4._M_node == (_List_node_base *)plVar1) goto LAB_001e7aec;
      } while ((raft_server *)iVar4._M_node[1]._M_next != server);
      std::
      _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&(this->commit_server_set_)._M_h,iVar4._M_node + 1);
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::_M_erase(plVar1,iVar4);
      uVar5 = 1;
LAB_001e7aec:
      pthread_mutex_unlock((pthread_mutex_t *)&this->commit_queue_lock_);
      peVar2 = (server->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar3 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (3 < iVar3) {
          peVar2 = (server->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_50,"global manager detected, %zu appends %zu commits are aborted",
                     local_58,uVar5);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                     ,"close_raft_server",0xca,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      return;
    }
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void nuraft_global_mgr::close_raft_server(raft_server* server) {
    // Cancel all requests for this raft server.
    size_t num_aborted_append = 0;
    {
        std::lock_guard<std::mutex> l(append_queue_lock_);
        auto entry = append_queue_.begin();
        while (entry != append_queue_.end()) {
            if (entry->get() == server) {
                append_server_set_.erase(*entry);
                entry = append_queue_.erase(entry);
                num_aborted_append++;
                break;
            } else {
                entry++;
            }
        }
    }

    size_t num_aborted_commit = 0;
    {
        std::lock_guard<std::mutex> l(commit_queue_lock_);
        auto entry = commit_queue_.begin();
        while (entry != commit_queue_.end()) {
            if (entry->get() == server) {
                commit_server_set_.erase(*entry);
                entry = commit_queue_.erase(entry);
                num_aborted_commit++;
                break;
            } else {
                entry++;
            }
        }
    }

    ptr<logger>& l_ = server->l_;
    p_in("global manager detected, %zu appends %zu commits are aborted",
         num_aborted_append,
         num_aborted_commit);
}